

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_expression.cpp
# Opt level: O2

string * __thiscall
duckdb::CollateExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CollateExpression *this)

{
  pointer pPVar1;
  SQLIdentifier *in_R8;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,"%s COLLATE %s",&local_71);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->child);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar1);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&this->collation);
  StringUtil::Format<std::__cxx11::string,duckdb::SQLIdentifier>
            (__return_storage_ptr__,(StringUtil *)local_30,&local_50,&local_70,in_R8);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

string CollateExpression::ToString() const {
	return StringUtil::Format("%s COLLATE %s", child->ToString(), SQLIdentifier(collation));
}